

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O0

Vec_Int_t *
Vta_ManUnsatCore(int iLit,sat_solver2 *pSat,int nConfMax,int fVerbose,int *piRetValue,int *pnConfls)

{
  ABC_INT64_T AVar1;
  int iVar2;
  Vec_Int_t *p;
  int nConfPrev;
  int RetValue;
  Vec_Int_t *vCore;
  abctime clk;
  int *pnConfls_local;
  int *piRetValue_local;
  int fVerbose_local;
  int nConfMax_local;
  sat_solver2 *pSat_local;
  Vec_Int_t *pVStack_10;
  int iLit_local;
  
  pSat_local._4_4_ = iLit;
  Abc_Clock();
  AVar1 = (pSat->stats).conflicts;
  if (piRetValue != (int *)0x0) {
    *piRetValue = 1;
  }
  if (pSat_local._4_4_ < 0) {
    p = Vec_IntAlloc(1);
    Vec_IntPush(p,-pSat_local._4_4_);
    pVStack_10 = p;
  }
  else {
    iVar2 = sat_solver2_solve(pSat,(lit *)((long)&pSat_local + 4),(lit *)&stack0xfffffffffffffff0,
                              (long)nConfMax,0,0,0);
    if (pnConfls != (int *)0x0) {
      *pnConfls = (int)(pSat->stats).conflicts - (int)AVar1;
    }
    if (iVar2 == 0) {
      if (piRetValue != (int *)0x0) {
        *piRetValue = -1;
      }
      pVStack_10 = (Vec_Int_t *)0x0;
    }
    else if (iVar2 == 1) {
      if (piRetValue != (int *)0x0) {
        *piRetValue = 0;
      }
      pVStack_10 = (Vec_Int_t *)0x0;
    }
    else {
      if (iVar2 != -1) {
        __assert_fail("RetValue == l_False",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absVta.c"
                      ,0x460,
                      "Vec_Int_t *Vta_ManUnsatCore(int, sat_solver2 *, int, int, int *, int *)");
      }
      Abc_Clock();
      pVStack_10 = (Vec_Int_t *)Sat_ProofCore(pSat);
    }
  }
  return pVStack_10;
}

Assistant:

Vec_Int_t * Vta_ManUnsatCore( int iLit, sat_solver2 * pSat, int nConfMax, int fVerbose, int * piRetValue, int * pnConfls )
{
    abctime clk = Abc_Clock();
    Vec_Int_t * vCore;
    int RetValue, nConfPrev = pSat->stats.conflicts;
    if ( piRetValue )
        *piRetValue = 1;
    // consider special case when PO points to the flop
    // this leads to immediate conflict in the first timeframe
    if ( iLit < 0 )
    {
        vCore = Vec_IntAlloc( 1 );
        Vec_IntPush( vCore, -iLit );
        return vCore;
    }
    // solve the problem
    RetValue = sat_solver2_solve( pSat, &iLit, &iLit+1, (ABC_INT64_T)nConfMax, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    if ( pnConfls )
        *pnConfls = (int)pSat->stats.conflicts - nConfPrev;
    if ( RetValue == l_Undef )
    {
        if ( piRetValue )
            *piRetValue = -1;
        return NULL;
    }
    if ( RetValue == l_True )
    {
        if ( piRetValue )
            *piRetValue = 0;
        return NULL;
    }
    if ( fVerbose )
    {
//        Abc_Print( 1, "%6d", (int)pSat->stats.conflicts - nConfPrev );
//        Abc_Print( 1, "UNSAT after %7d conflicts.      ", pSat->stats.conflicts );
//        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }
    assert( RetValue == l_False );
    // derive the UNSAT core
    clk = Abc_Clock();
    vCore = (Vec_Int_t *)Sat_ProofCore( pSat );
    if ( fVerbose )
    {
//        Abc_Print( 1, "Core is %8d vars    (out of %8d).   ", Vec_IntSize(vCore), sat_solver2_nvars(pSat) );
//        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }
    return vCore;
}